

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

int __thiscall
CVmObjStringBuffer::compare_to(CVmObjStringBuffer *this,vm_obj_id_t self,vm_val_t *val)

{
  int iVar1;
  CVmObject *this_00;
  vm_strbuf_ext *pvVar2;
  char *pcVar3;
  int *in_RDX;
  CVmObjStringBuffer *in_RDI;
  int32_t i;
  wchar_t *buf2;
  wchar_t *buf1;
  int32_t len2;
  int32_t len1;
  CVmObjStringBuffer *other;
  char *str;
  vm_val_t *in_stack_ffffffffffffff98;
  int local_4c;
  wchar_t *local_48;
  char *in_stack_ffffffffffffffc0;
  wchar_t *pwVar4;
  undefined4 in_stack_ffffffffffffffc8;
  int32_t iVar5;
  undefined4 in_stack_ffffffffffffffcc;
  int32_t iVar6;
  int local_4;
  
  if ((*in_RDX == 5) && (iVar1 = is_string_buffer_obj(0), iVar1 != 0)) {
    this_00 = vm_objp(0);
    pvVar2 = get_ext(in_RDI);
    iVar6 = pvVar2->len;
    pvVar2 = get_ext((CVmObjStringBuffer *)this_00);
    iVar5 = pvVar2->len;
    pvVar2 = get_ext(in_RDI);
    pwVar4 = pvVar2->buf;
    pvVar2 = get_ext((CVmObjStringBuffer *)this_00);
    local_48 = pvVar2->buf;
    for (local_4c = 0; local_4c < iVar6 && local_4c < iVar5; local_4c = local_4c + 1) {
      if (*pwVar4 < *local_48) {
        return -1;
      }
      if (*local_48 < *pwVar4) {
        return 1;
      }
      pwVar4 = pwVar4 + 1;
      local_48 = local_48 + 1;
    }
    local_4 = iVar6 - iVar5;
  }
  else {
    pcVar3 = vm_val_t::get_as_string(in_stack_ffffffffffffff98);
    if (pcVar3 == (char *)0x0) {
      err_throw(0);
    }
    local_4 = compare_str((CVmObjStringBuffer *)
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc0);
  }
  return local_4;
}

Assistant:

int CVmObjStringBuffer::compare_to(VMG_ vm_obj_id_t self,
                                   const vm_val_t *val) const
{
    /* 
     *   we can compare our contents to another string buffer, or to a
     *   regular string object 
     */
    const char *str;
    if (val->typ == VM_OBJ && is_string_buffer_obj(vmg_ val->val.obj))
    {
        /* compare the buffers character by character */
        CVmObjStringBuffer *other =
            (CVmObjStringBuffer *)vm_objp(vmg_ val->val.obj);
        int32_t len1 = get_ext()->len, len2 = other->get_ext()->len;
        const wchar_t *buf1 = get_ext()->buf, *buf2 = other->get_ext()->buf;
        for (int32_t i = 0 ; i < len1 && i < len2 ; ++i, ++buf1, ++buf2)
        {
            if (*buf1 < *buf2)
                return -1;
            else if (*buf1 > *buf2)
                return 1;
        }

        /* 
         *   They're equal up to the full length of the shorter string.  If
         *   we ran out of strings at the same time, they're equal; otherwise
         *   the longer string compares greater 
         */
        return len1 - len2;
    }
    else if ((str = val->get_as_string(vmg0_)) != 0)
    {
        /* compare to a constant string */
        return compare_str(str);
    }
    else
    {
        /* the other value isn't comparable to string */
        err_throw(VMERR_INVALID_COMPARISON);
        AFTER_ERR_THROW(return 0;)
    }
}